

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall cmGraphVizWriter::WriteLegend(cmGraphVizWriter *this,cmGeneratedFileStream *fs)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs,
             "subgraph clusterLegend {\n  label = \"Legend\";\n  color = black;\n  edge [ style = invis ];\n  legendNode0 [ label = \"Executable\", shape = "
             ,0x86);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"egg",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode1 [ label = \"Static Library\", shape = ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"octagon",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode2 [ label = \"Shared Library\", shape = ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"doubleoctagon",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode3 [ label = \"Module Library\", shape = ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"tripleoctagon",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode4 [ label = \"Interface Library\", shape = ",0x39);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"pentagon",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode5 [ label = \"Object Library\", shape = ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"hexagon",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode6 [ label = \"Unknown Library\", shape = ",0x37);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"septagon",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode7 [ label = \"Custom Target\", shape = ",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"box",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode0 -> legendNode1 [ style = ",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"solid",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode0 -> legendNode2 [ style = ",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"solid",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs,
             " ];\n  legendNode0 -> legendNode3;\n  legendNode1 -> legendNode4 [ label = \"Interface\", style = "
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"dashed",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode2 -> legendNode5 [ label = \"Private\", style = ",0x3e)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"dotted",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode3 -> legendNode6 [ style = ",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"solid",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fs," ];\n  legendNode0 -> legendNode7;\n}\n",0x24);
  return;
}

Assistant:

void cmGraphVizWriter::WriteLegend(cmGeneratedFileStream& fs)
{
  // Note that the subgraph name must start with "cluster", as done here, to
  // make Graphviz layout engines do the right thing and keep the nodes
  // together.
  /* clang-format off */
  fs << "subgraph clusterLegend {\n"
        "  label = \"Legend\";\n"
        // Set the color of the box surrounding the legend.
        "  color = black;\n"
        // We use invisible edges just to enforce the layout.
        "  edge [ style = invis ];\n"
        // Nodes.
        "  legendNode0 [ label = \"Executable\", shape = "
     << GRAPHVIZ_NODE_SHAPE_EXECUTABLE << " ];\n"
        "  legendNode1 [ label = \"Static Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_STATIC << " ];\n"
        "  legendNode2 [ label = \"Shared Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_SHARED << " ];\n"
        "  legendNode3 [ label = \"Module Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_MODULE << " ];\n"
        "  legendNode4 [ label = \"Interface Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_INTERFACE << " ];\n"
        "  legendNode5 [ label = \"Object Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_OBJECT << " ];\n"
        "  legendNode6 [ label = \"Unknown Library\", shape = "
     << GRAPHVIZ_NODE_SHAPE_LIBRARY_UNKNOWN << " ];\n"
        "  legendNode7 [ label = \"Custom Target\", shape = "
     << GRAPHVIZ_NODE_SHAPE_UTILITY << " ];\n"
        // Edges.
        // Some of those are dummy (invisible) edges to enforce a layout.
        "  legendNode0 -> legendNode1 [ style = "
     << GRAPHVIZ_EDGE_STYLE_PUBLIC << " ];\n"
        "  legendNode0 -> legendNode2 [ style = "
     << GRAPHVIZ_EDGE_STYLE_PUBLIC << " ];\n"
        "  legendNode0 -> legendNode3;\n"
        "  legendNode1 -> legendNode4 [ label = \"Interface\", style = "
     << GRAPHVIZ_EDGE_STYLE_INTERFACE << " ];\n"
        "  legendNode2 -> legendNode5 [ label = \"Private\", style = "
     << GRAPHVIZ_EDGE_STYLE_PRIVATE << " ];\n"
        "  legendNode3 -> legendNode6 [ style = "
     << GRAPHVIZ_EDGE_STYLE_PUBLIC << " ];\n"
        "  legendNode0 -> legendNode7;\n"
        "}\n";
  /* clang-format off */
}